

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_extension.c
# Opt level: O1

int dlep_extension_radio_write_session_init_ack
              (dlep_extension *ext,dlep_session *session,oonf_layer2_neigh_key *neigh)

{
  oonf_layer2_neighbor_index idx;
  oonf_layer2_network_index idx_00;
  uint uVar1;
  oonf_layer2_net *poVar2;
  oonf_layer2_metadata *poVar3;
  int line;
  long lVar4;
  oonf_log_source source;
  oonf_layer2_data *poVar5;
  ulong uVar6;
  
  poVar2 = oonf_layer2_net_add((session->l2_listener).name);
  if (poVar2 == (oonf_layer2_net *)0x0) {
    uVar6 = 0xffffffff;
    if ((log_global_mask[session->log_source] & 4) != 0) {
      oonf_log(LOG_SEVERITY_WARN,session->log_source,"src/generic/dlep/dlep_extension.c",0x11f,
               (void *)0x0,0,"Could not add l2net for new interface");
    }
    goto LAB_00122a8d;
  }
  if (ext->neigh_mapping_count != 0) {
    lVar4 = 0x18;
    uVar6 = 0;
    do {
      if (*(char *)((long)ext->neigh_mapping + lVar4 + -4) == '\x01') {
        idx = *(oonf_layer2_neighbor_index *)((long)ext->neigh_mapping + lVar4 + -8);
        poVar5 = poVar2->neighdata + idx;
        if ((poVar5->_origin == (oonf_layer2_origin *)0x0) ||
           (poVar5->_meta == (oonf_layer2_metadata *)0x0)) {
          poVar3 = oonf_layer2_neigh_metadata_get(idx);
          oonf_layer2_data_set
                    (poVar5,session->l2_default_origin,poVar3,
                     (oonf_layer2_value *)((long)&ext->neigh_mapping->dlep + lVar4));
        }
      }
      uVar6 = uVar6 + 1;
      lVar4 = lVar4 + 0x40;
    } while (uVar6 < ext->neigh_mapping_count);
  }
  if (ext->if_mapping_count != 0) {
    lVar4 = 0x18;
    uVar6 = 0;
    do {
      if (*(char *)((long)ext->if_mapping + lVar4 + -4) == '\x01') {
        idx_00 = *(oonf_layer2_network_index *)((long)ext->if_mapping + lVar4 + -8);
        poVar5 = poVar2->data + idx_00;
        if ((poVar5->_origin == (oonf_layer2_origin *)0x0) ||
           (poVar5->_meta == (oonf_layer2_metadata *)0x0)) {
          poVar3 = oonf_layer2_net_metadata_get(idx_00);
          oonf_layer2_data_set
                    (poVar5,session->l2_default_origin,poVar3,
                     (oonf_layer2_value *)((long)&ext->if_mapping->dlep + lVar4));
        }
      }
      uVar6 = uVar6 + 1;
      lVar4 = lVar4 + 0x40;
    } while (uVar6 < ext->if_mapping_count);
  }
  if ((log_global_mask[session->log_source] & 1) != 0) {
    oonf_log(LOG_SEVERITY_DEBUG,session->log_source,"src/generic/dlep/dlep_extension.c",0x142,
             (void *)0x0,0,"Mapping default neighbor data (%s) to TLVs",poVar2);
  }
  uVar1 = dlep_writer_map_l2neigh_data
                    (&session->writer,ext,poVar2->neighdata,(oonf_layer2_data *)0x0);
  uVar6 = (ulong)uVar1;
  source = session->log_source;
  if (uVar1 == 0) {
    if ((log_global_mask[source] & 1) != 0) {
      oonf_log(LOG_SEVERITY_DEBUG,source,"src/generic/dlep/dlep_extension.c",0x14a,(void *)0x0,0,
               "Mapping if data (%s) to TLVs",poVar2);
    }
    uVar1 = dlep_writer_map_l2net_data(&session->writer,ext,poVar2->data);
    if (uVar1 == 0) {
      uVar6 = 0;
      goto LAB_00122a8d;
    }
    uVar6 = (ulong)uVar1;
    source = session->log_source;
    if ((log_global_mask[source] & 4) == 0) goto LAB_00122a8d;
    uVar1 = ext->id;
    line = 0x14d;
  }
  else {
    if ((log_global_mask[source] & 4) == 0) goto LAB_00122a8d;
    uVar1 = ext->id;
    line = 0x145;
  }
  oonf_log(LOG_SEVERITY_WARN,source,"src/generic/dlep/dlep_extension.c",line,(void *)0x0,0,
           "tlv mapping for extension %d failed: %d",(ulong)uVar1,uVar6);
LAB_00122a8d:
  return (int)uVar6;
}

Assistant:

int
dlep_extension_radio_write_session_init_ack(
  struct dlep_extension *ext, struct dlep_session *session, const struct oonf_layer2_neigh_key *neigh __attribute__((unused))) {
  const struct oonf_layer2_metadata *meta;
  struct oonf_layer2_net *l2net;
  struct oonf_layer2_data *l2data;
  enum oonf_layer2_neighbor_index neigh_idx;
  enum oonf_layer2_network_index net_idx;
  size_t i;
  int result;

  /* first make sure defaults are set correctly */
  l2net = oonf_layer2_net_add(session->l2_listener.name);
  if (!l2net) {
    OONF_WARN(session->log_source, "Could not add l2net for new interface");
    return -1;
  }

  /* adding default neighbor data for mandatory values */
  for (i = 0; i < ext->neigh_mapping_count; i++) {
    if (!ext->neigh_mapping[i].mandatory) {
      continue;
    }

    neigh_idx = ext->neigh_mapping[i].layer2;
    l2data = &l2net->neighdata[neigh_idx];

    if (!oonf_layer2_data_has_value(l2data)) {
      meta = oonf_layer2_neigh_metadata_get(neigh_idx);
      oonf_layer2_data_set(l2data, session->l2_default_origin, meta, &ext->neigh_mapping[i].default_value);
    }
  }

  /* adding default interface data for mandatory values */
  for (i = 0; i < ext->if_mapping_count; i++) {
    if (!ext->if_mapping[i].mandatory) {
      continue;
    }

    net_idx = ext->if_mapping[i].layer2;
    l2data = &l2net->data[net_idx];

    if (!oonf_layer2_data_has_value(l2data)) {
      meta = oonf_layer2_net_metadata_get(net_idx);
      oonf_layer2_data_set(l2data, session->l2_default_origin, meta, &ext->if_mapping[i].default_value);
    }
  }

  /* write default metric values */
  OONF_DEBUG(session->log_source, "Mapping default neighbor data (%s) to TLVs", l2net->name);
  result = dlep_writer_map_l2neigh_data(&session->writer, ext, l2net->neighdata, NULL);
  if (result) {
    OONF_WARN(session->log_source, "tlv mapping for extension %d failed: %d", ext->id, result);
    return result;
  }

  /* write network wide data */
  OONF_DEBUG(session->log_source, "Mapping if data (%s) to TLVs", l2net->name);
  result = dlep_writer_map_l2net_data(&session->writer, ext, l2net->data);
  if (result) {
    OONF_WARN(session->log_source, "tlv mapping for extension %d failed: %d", ext->id, result);
    return result;
  }
  return 0;
}